

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_immecho(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA **ppDVar1;
  DESCRIPTOR_DATA *pDVar2;
  char buffer [9216];
  char acStack_2428 [9224];
  
  if (*argument == '\0') {
    send_to_char("Global echo what?\n\r",ch);
    return;
  }
  pDVar2 = descriptor_list;
  if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
    do {
      if ((pDVar2->connected == 0) && (0x33 < pDVar2->character->level)) {
        colorconv(acStack_2428,argument,pDVar2->character);
        send_to_char(acStack_2428,pDVar2->character);
        send_to_char("\n\r",pDVar2->character);
      }
      ppDVar1 = &pDVar2->next;
      pDVar2 = *ppDVar1;
    } while (*ppDVar1 != (DESCRIPTOR_DATA *)0x0);
  }
  return;
}

Assistant:

void do_immecho(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char buffer[MAX_STRING_LENGTH * 2];

	if (argument[0] == '\0')
	{
		send_to_char("Global echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING && (d->character->level > 51))
		{
			colorconv(buffer, argument, d->character);
			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}